

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O0

uint32_t FAudioMasteringVoice_GetChannelMask(FAudioMasteringVoice *voice,uint32_t *pChannelMask)

{
  code *pcVar1;
  int iVar2;
  uint32_t uVar3;
  undefined4 *in_RSI;
  long *in_RDI;
  SDL_AssertState sdl_assert_state_2;
  SDL_AssertState sdl_assert_state_1;
  SDL_AssertState sdl_assert_state;
  
  do {
    if (*(int *)((long)in_RDI + 0xc) == 2) goto LAB_00126152;
    iVar2 = SDL_ReportAssertion(&FAudioMasteringVoice_GetChannelMask::sdl_assert_data,
                                "FAudioMasteringVoice_GetChannelMask",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/GloriousEggroll[P]FAudio/src/FAudio.c"
                                ,0x978);
  } while (iVar2 == 0);
  if (iVar2 == 1) {
    pcVar1 = (code *)swi(3);
    uVar3 = (*pcVar1)();
    return uVar3;
  }
LAB_00126152:
  do {
    if (*(long *)(*in_RDI + 0x48) != 0) goto LAB_001261a8;
    iVar2 = SDL_ReportAssertion(&FAudioMasteringVoice_GetChannelMask::sdl_assert_data_1,
                                "FAudioMasteringVoice_GetChannelMask",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/GloriousEggroll[P]FAudio/src/FAudio.c"
                                ,0x979);
  } while (iVar2 == 0);
  if (iVar2 == 1) {
    pcVar1 = (code *)swi(3);
    uVar3 = (*pcVar1)();
    return uVar3;
  }
LAB_001261a8:
  do {
    if (in_RSI != (undefined4 *)0x0) goto LAB_001261f3;
    iVar2 = SDL_ReportAssertion(&FAudioMasteringVoice_GetChannelMask::sdl_assert_data_2,
                                "FAudioMasteringVoice_GetChannelMask",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/GloriousEggroll[P]FAudio/src/FAudio.c"
                                ,0x97a);
  } while (iVar2 == 0);
  if (iVar2 == 1) {
    pcVar1 = (code *)swi(3);
    uVar3 = (*pcVar1)();
    return uVar3;
  }
LAB_001261f3:
  *in_RSI = *(undefined4 *)(*(long *)(*in_RDI + 0x48) + 0x14);
  return 0;
}

Assistant:

FAUDIOAPI uint32_t FAudioMasteringVoice_GetChannelMask(
	FAudioMasteringVoice *voice,
	uint32_t *pChannelMask
) {
	LOG_API_ENTER(voice->audio)
	FAudio_assert(voice->type == FAUDIO_VOICE_MASTER);
	FAudio_assert(voice->audio->mixFormat != NULL);
	FAudio_assert(pChannelMask != NULL);

	*pChannelMask = voice->audio->mixFormat->dwChannelMask;
	LOG_API_EXIT(voice->audio)
	return 0;
}